

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_app.cpp
# Opt level: O0

Error * __thiscall
ot::commissioner::CommissionerApp::PanIdQuery
          (Error *__return_storage_ptr__,CommissionerApp *this,uint32_t aChannelMask,uint16_t aPanId
          ,string *aDstAddr)

{
  uint uVar1;
  element_type *peVar2;
  Error *aError;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  basic_string_view<char> bVar3;
  format_args args;
  string_view fmt;
  ErrorCode local_16c;
  Error local_168;
  anon_class_1_0_00000001 local_13a;
  v10 local_139;
  v10 *local_138;
  size_t local_130;
  string local_128;
  Error local_108;
  undefined1 local_c9;
  string *local_c8;
  string *aDstAddr_local;
  uint16_t aPanId_local;
  CommissionerApp *pCStack_b8;
  uint32_t aChannelMask_local;
  CommissionerApp *this_local;
  Error *error;
  undefined1 local_98 [16];
  v10 *local_88;
  ulong local_80;
  v10 *local_78;
  size_t sStack_70;
  string *local_68;
  v10 *local_60;
  v10 **local_58;
  v10 **local_50;
  v10 *local_48;
  size_t sStack_40;
  Error **local_38;
  undefined1 *local_30;
  Error **local_28;
  Error **local_20;
  undefined8 local_18;
  undefined1 *local_10;
  
  local_c9 = 0;
  local_c8 = aDstAddr;
  aDstAddr_local._2_2_ = aPanId;
  aDstAddr_local._4_4_ = aChannelMask;
  pCStack_b8 = this;
  this_local = (CommissionerApp *)__return_storage_ptr__;
  Error::Error(__return_storage_ptr__);
  uVar1 = (*(this->super_CommissionerHandler)._vptr_CommissionerHandler[0xf])();
  if ((uVar1 & 1) == 0) {
    PanIdQuery::anon_class_1_0_00000001::operator()(&local_13a);
    local_58 = &local_138;
    local_60 = &local_139;
    bVar3 = ::fmt::v10::operator()(local_60);
    local_130 = bVar3.size_;
    local_138 = (v10 *)bVar3.data_;
    ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
    local_68 = &local_128;
    local_78 = local_138;
    sStack_70 = local_130;
    local_50 = &local_78;
    local_88 = local_138;
    local_80 = local_130;
    local_48 = local_88;
    sStack_40 = local_80;
    error = (Error *)::fmt::v10::
                     make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
    local_30 = local_98;
    local_38 = &error;
    local_18 = 0;
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)local_38;
    fmt.size_ = 0;
    fmt.data_ = (char *)local_80;
    local_28 = local_38;
    local_20 = local_38;
    local_10 = local_30;
    ::fmt::v10::vformat_abi_cxx11_(&local_128,local_88,fmt,args);
    Error::Error(&local_108,kInvalidState,&local_128);
    Error::operator=(__return_storage_ptr__,&local_108);
    Error::~Error(&local_108);
    std::__cxx11::string::~string((string *)&local_128);
  }
  else {
    peVar2 = std::
             __shared_ptr_access<ot::commissioner::Commissioner,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<ot::commissioner::Commissioner,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->mCommissioner);
    (*peVar2->_vptr_Commissioner[0x2e])
              (&local_168,peVar2,(ulong)aDstAddr_local._4_4_,(ulong)aDstAddr_local._2_2_,local_c8);
    aError = Error::operator=(__return_storage_ptr__,&local_168);
    local_16c = kNone;
    commissioner::operator!=(aError,&local_16c);
    Error::~Error(&local_168);
  }
  return __return_storage_ptr__;
}

Assistant:

Error CommissionerApp::PanIdQuery(uint32_t aChannelMask, uint16_t aPanId, const std::string &aDstAddr)
{
    Error error;

    VerifyOrExit(IsActive(), error = ERROR_INVALID_STATE("the commissioner is not active"));

    SuccessOrExit(error = mCommissioner->PanIdQuery(aChannelMask, aPanId, aDstAddr));

exit:
    return error;
}